

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::
     CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
     ::doEndLoop(RelevantLiveLocalsWalker *self,Expression **currp)

{
  map<wasm::Name,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  *this;
  pointer *pppBVar1;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_00;
  Expression *pEVar2;
  pointer ppBVar3;
  BasicBlock *pBVar4;
  mapped_type *pmVar5;
  char *__to;
  char *extraout_RDX;
  char *__to_00;
  char *extraout_RDX_00;
  pointer ppBVar6;
  
  this_00 = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             *)(self->
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               ).
               super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               .currBasicBlock;
  pBVar4 = startBasicBlock((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                            *)self);
  link(this_00,(char *)pBVar4,__to);
  pEVar2 = *currp;
  if (pEVar2->_id == LoopId) {
    if (pEVar2[1].type.id != 0) {
      pBVar4 = (self->
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               ).
               super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               .loopLastBlockStack.
               super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
      this = &(self->
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ).
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .branches;
      pmVar5 = std::
               map<wasm::Name,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
               ::operator[](this,(key_type *)(pEVar2 + 1));
      ppBVar3 = (pmVar5->
                super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      __to_00 = extraout_RDX;
      for (ppBVar6 = (pmVar5->
                     super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar3;
          ppBVar6 = ppBVar6 + 1) {
        link((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              *)*ppBVar6,(char *)pBVar4,__to_00);
        __to_00 = extraout_RDX_00;
      }
      std::
      map<wasm::Name,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
      ::erase(this,(key_type *)(pEVar2 + 1));
    }
    pppBVar1 = &(self->
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                ).
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                .loopLastBlockStack.
                super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + -1;
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Loop]");
}

Assistant:

static void doEndLoop(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->link(last, self->startBasicBlock()); // fallthrough
    auto* curr = (*currp)->cast<Loop>();
    // branches to the top of the loop
    if (curr->name.is()) {
      auto* loopStart = self->loopLastBlockStack.back();
      auto& origins = self->branches[curr->name];
      for (auto* origin : origins) {
        self->link(origin, loopStart);
      }
      self->branches.erase(curr->name);
    }
    self->loopLastBlockStack.pop_back();
  }